

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::fastPresolveLoop(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Result RVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  while( true ) {
    uVar1 = this->model->num_col_;
    uVar6 = this->model->num_row_;
    uVar2 = this->numDeletedRows;
    uVar7 = this->numDeletedCols;
    this->oldNumCol = uVar1 - uVar7;
    this->oldNumRow = uVar6 - uVar2;
    RVar11 = removeRowSingletons(this,postsolve_stack);
    if (RVar11 != kOk) {
      return RVar11;
    }
    RVar11 = presolveChangedRows(this,postsolve_stack);
    if (RVar11 != kOk) {
      return RVar11;
    }
    RVar11 = removeDoubletonEquations(this,postsolve_stack);
    if (RVar11 != kOk) {
      return RVar11;
    }
    RVar11 = presolveColSingletons(this,postsolve_stack);
    if (RVar11 != kOk) break;
    RVar11 = presolveChangedCols(this,postsolve_stack);
    if (RVar11 != kOk) {
      return RVar11;
    }
    uVar3 = this->oldNumCol;
    uVar8 = this->oldNumRow;
    uVar4 = this->model->num_col_;
    uVar9 = this->model->num_row_;
    uVar5 = this->numDeletedRows;
    uVar10 = this->numDeletedCols;
    auVar13._0_8_ = (double)(int)((uVar3 - uVar4) + uVar10) * 100.0;
    auVar13._8_8_ = (double)(int)((uVar8 - uVar9) + uVar5) * 100.0;
    auVar14._8_8_ = (double)(int)uVar8;
    auVar14._0_8_ = (double)(int)uVar3;
    auVar14 = divpd(auVar13,auVar14);
    dVar12 = auVar14._0_8_;
    if (auVar14._0_8_ <= auVar14._8_8_) {
      dVar12 = auVar14._8_8_;
    }
    if (dVar12 <= 0.01) {
      return kOk;
    }
  }
  return RVar11;
}

Assistant:

HPresolve::Result HPresolve::fastPresolveLoop(
    HighsPostsolveStack& postsolve_stack) {
  do {
    storeCurrentProblemSize();

    HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedRows(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(removeDoubletonEquations(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveColSingletons(postsolve_stack));

    HPRESOLVE_CHECKED_CALL(presolveChangedCols(postsolve_stack));

  } while (problemSizeReduction() > 0.01);

  return Result::kOk;
}